

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientService.cpp
# Opt level: O1

void __thiscall ClientService::setServerIP(ClientService *this,string *ip)

{
  int port;
  pointer pcVar1;
  ClientSocketUDP *this_00;
  string local_40;
  
  std::__cxx11::string::_M_assign((string *)this);
  this_00 = (ClientSocketUDP *)operator_new(0x28);
  port = this->serverPort;
  pcVar1 = (this->serverIp)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->serverIp)._M_string_length);
  ClientSocketUDP::ClientSocketUDP(this_00,2,2,0,port,&local_40);
  this->clientSocketUDP = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ClientService::setServerIP(string ip) {
    this->serverIp = ip;
    clientSocketUDP = new ClientSocketUDP(AF_INET, SOCK_DGRAM, 0, serverPort, serverIp);
}